

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binary_executor.hpp
# Opt level: O1

double duckdb::BinaryLambdaWrapper::
       Operation<duckdb::JaccardFunction(duckdb::DataChunk&,duckdb::ExpressionState&,duckdb::Vector&)::__0,bool,duckdb::string_t,duckdb::string_t,double>
                 (anon_class_8_1_6971b95b fun,string_t left,string_t right,ValidityMask *mask,
                 idx_t idx)

{
  ulong uVar1;
  pointer pcVar2;
  size_type sVar3;
  long lVar4;
  InvalidInputException *this;
  ulong uVar5;
  long lVar6;
  long lVar8;
  undefined1 auVar7 [16];
  undefined1 auVar9 [16];
  long lVar10;
  long lVar11;
  char cVar12;
  ushort uVar13;
  byte bVar24;
  char cVar25;
  byte bVar26;
  char cVar27;
  byte bVar28;
  char cVar29;
  byte bVar30;
  char cVar31;
  byte bVar32;
  undefined1 auVar22 [16];
  undefined1 auVar33 [12];
  undefined1 auVar34 [12];
  undefined1 auVar37 [16];
  undefined1 auVar38 [16];
  undefined1 auVar40 [16];
  undefined1 auVar42 [16];
  undefined1 auVar43 [16];
  bitset<256UL> m_str;
  bitset<256UL> m_txt;
  pointer local_a8;
  ulong uStack_a0;
  size_type local_98;
  undefined8 uStack_90;
  string local_88;
  undefined8 local_68;
  long local_60;
  pointer local_58;
  ulong auStack_50 [4];
  undefined8 local_30;
  long local_28;
  undefined4 uVar14;
  undefined6 uVar15;
  undefined8 uVar16;
  undefined1 auVar17 [12];
  undefined1 auVar18 [12];
  undefined1 auVar19 [14];
  undefined1 auVar20 [14];
  undefined1 auVar21 [16];
  undefined1 auVar23 [16];
  undefined1 auVar35 [14];
  undefined1 auVar36 [14];
  undefined1 auVar39 [16];
  undefined1 auVar41 [16];
  
  local_30 = fun.result;
  local_28 = left.value._0_8_;
  local_68 = left.value._8_8_;
  uVar5 = local_68;
  local_60 = right.value._0_8_;
  if (((ulong)fun.result & 0xffffffff) != 0) {
    local_68._0_4_ = left.value._8_4_;
    if (((undefined1  [16])left.value & (undefined1  [16])0xffffffff) != (undefined1  [16])0x0) {
      local_88.field_2._M_allocated_capacity = 0;
      local_88.field_2._8_8_ = 0;
      local_88._M_dataplus._M_p = (pointer)0x0;
      local_88._M_string_length = 0;
      auStack_50[1] = 0;
      auStack_50[2] = 0;
      local_58 = (pointer)0x0;
      auStack_50[0] = 0;
      local_98 = 0;
      uStack_90 = 0;
      local_a8 = (pointer)0x0;
      uStack_a0 = 0;
      lVar4 = left.value._0_8_;
      if ((uint)fun.result < 0xd) {
        lVar4 = (long)&local_30 + 4;
      }
      uVar5 = 0;
      do {
        (&local_a8)[*(byte *)(lVar4 + uVar5) >> 6] =
             (pointer)((ulong)(&local_a8)[*(byte *)(lVar4 + uVar5) >> 6] |
                      1L << (*(byte *)(lVar4 + uVar5) & 0x3f));
        sVar3 = local_98;
        uVar1 = uStack_a0;
        pcVar2 = local_a8;
        uVar5 = uVar5 + 1;
      } while (((ulong)fun.result & 0xffffffff) != uVar5);
      local_88.field_2._M_allocated_capacity = local_98;
      local_88.field_2._8_8_ = 0;
      local_88._M_dataplus._M_p = local_a8;
      local_88._M_string_length = uStack_a0;
      local_98 = 0;
      uStack_90 = 0;
      local_a8 = (pointer)0x0;
      uStack_a0 = 0;
      lVar4 = right.value._0_8_;
      if ((uint)local_68 < 0xd) {
        lVar4 = (long)&local_68 + 4;
      }
      uVar5 = 0;
      do {
        (&local_a8)[*(byte *)(lVar4 + uVar5) >> 6] =
             (pointer)((ulong)(&local_a8)[*(byte *)(lVar4 + uVar5) >> 6] |
                      1L << (*(byte *)(lVar4 + uVar5) & 0x3f));
        uVar5 = uVar5 + 1;
      } while ((left.value._8_8_ & 0xffffffff) != uVar5);
      auStack_50[1] = local_98;
      auStack_50[2] = 0;
      local_58 = local_a8;
      auStack_50[0] = uStack_a0;
      local_98 = sVar3;
      uStack_90 = 0;
      local_a8 = pcVar2;
      uStack_a0 = uVar1;
      lVar4 = 0;
      do {
        (&local_a8)[lVar4] = (pointer)((ulong)(&local_a8)[lVar4] & (ulong)(&local_58)[lVar4]);
        (&uStack_a0)[lVar4] = (&uStack_a0)[lVar4] & auStack_50[lVar4];
        lVar4 = lVar4 + 2;
      } while (lVar4 != 4);
      lVar4 = 0;
      lVar6 = 0;
      lVar8 = 0;
      do {
        auVar22 = *(undefined1 (*) [16])(&local_a8 + lVar4);
        auVar37._0_2_ = auVar22._0_2_ >> 1;
        auVar37._2_2_ = auVar22._2_2_ >> 1;
        auVar37._4_2_ = auVar22._4_2_ >> 1;
        auVar37._6_2_ = auVar22._6_2_ >> 1;
        auVar37._8_2_ = auVar22._8_2_ >> 1;
        auVar37._10_2_ = auVar22._10_2_ >> 1;
        auVar37._12_2_ = auVar22._12_2_ >> 1;
        auVar37._14_2_ = auVar22._14_2_ >> 1;
        auVar37 = auVar37 & _DAT_01f1d7a0;
        uVar13 = CONCAT11(auVar22[1] - auVar37[1],auVar22[0] - auVar37[0]);
        uVar14 = CONCAT13(auVar22[3] - auVar37[3],CONCAT12(auVar22[2] - auVar37[2],uVar13));
        uVar15 = CONCAT15(auVar22[5] - auVar37[5],CONCAT14(auVar22[4] - auVar37[4],uVar14));
        uVar16 = CONCAT17(auVar22[7] - auVar37[7],CONCAT16(auVar22[6] - auVar37[6],uVar15));
        auVar17._0_10_ = CONCAT19(auVar22[9] - auVar37[9],CONCAT18(auVar22[8] - auVar37[8],uVar16));
        auVar17[10] = auVar22[10] - auVar37[10];
        auVar17[0xb] = auVar22[0xb] - auVar37[0xb];
        auVar19[0xc] = auVar22[0xc] - auVar37[0xc];
        auVar19._0_12_ = auVar17;
        auVar19[0xd] = auVar22[0xd] - auVar37[0xd];
        auVar21[0xe] = auVar22[0xe] - auVar37[0xe];
        auVar21._0_14_ = auVar19;
        auVar21[0xf] = auVar22[0xf] - auVar37[0xf];
        auVar37 = auVar21 & _DAT_01f1d7b0;
        auVar22._0_2_ = uVar13 >> 2;
        auVar22._2_2_ = (ushort)((uint)uVar14 >> 0x12);
        auVar22._4_2_ = (ushort)((uint6)uVar15 >> 0x22);
        auVar22._6_2_ = (ushort)((ulong)uVar16 >> 0x32);
        auVar22._8_2_ = (ushort)((unkuint10)auVar17._0_10_ >> 0x42);
        auVar22._10_2_ = auVar17._10_2_ >> 2;
        auVar22._12_2_ = auVar19._12_2_ >> 2;
        auVar22._14_2_ = auVar21._14_2_ >> 2;
        auVar22 = auVar22 & _DAT_01f1d7b0;
        cVar12 = auVar22[0] + auVar37[0];
        bVar24 = auVar22[1] + auVar37[1];
        uVar13 = CONCAT11(bVar24,cVar12);
        cVar25 = auVar22[2] + auVar37[2];
        bVar26 = auVar22[3] + auVar37[3];
        uVar14 = CONCAT13(bVar26,CONCAT12(cVar25,uVar13));
        cVar27 = auVar22[4] + auVar37[4];
        bVar28 = auVar22[5] + auVar37[5];
        uVar15 = CONCAT15(bVar28,CONCAT14(cVar27,uVar14));
        cVar29 = auVar22[6] + auVar37[6];
        bVar30 = auVar22[7] + auVar37[7];
        uVar16 = CONCAT17(bVar30,CONCAT16(cVar29,uVar15));
        cVar31 = auVar22[8] + auVar37[8];
        bVar32 = auVar22[9] + auVar37[9];
        auVar18._0_10_ = CONCAT19(bVar32,CONCAT18(cVar31,uVar16));
        auVar18[10] = auVar22[10] + auVar37[10];
        auVar18[0xb] = auVar22[0xb] + auVar37[0xb];
        auVar20[0xc] = auVar22[0xc] + auVar37[0xc];
        auVar20._0_12_ = auVar18;
        auVar20[0xd] = auVar22[0xd] + auVar37[0xd];
        auVar23[0xe] = auVar22[0xe] + auVar37[0xe];
        auVar23._0_14_ = auVar20;
        auVar23[0xf] = auVar22[0xf] + auVar37[0xf];
        auVar38[0] = (char)(uVar13 >> 4) + cVar12;
        auVar38[1] = (bVar24 >> 4) + bVar24;
        auVar38[2] = (char)(ushort)((uint)uVar14 >> 0x14) + cVar25;
        auVar38[3] = (bVar26 >> 4) + bVar26;
        auVar38[4] = (char)(ushort)((uint6)uVar15 >> 0x24) + cVar27;
        auVar38[5] = (bVar28 >> 4) + bVar28;
        auVar38[6] = (char)(ushort)((ulong)uVar16 >> 0x34) + cVar29;
        auVar38[7] = (bVar30 >> 4) + bVar30;
        auVar38[8] = (char)(ushort)((unkuint10)auVar18._0_10_ >> 0x44) + cVar31;
        auVar38[9] = (bVar32 >> 4) + bVar32;
        auVar38[10] = (char)(auVar18._10_2_ >> 4) + auVar18[10];
        auVar38[0xb] = (auVar18[0xb] >> 4) + auVar18[0xb];
        auVar38[0xc] = (char)(auVar20._12_2_ >> 4) + auVar20[0xc];
        auVar38[0xd] = (auVar20[0xd] >> 4) + auVar20[0xd];
        auVar38[0xe] = (char)(auVar23._14_2_ >> 4) + auVar23[0xe];
        auVar38[0xf] = (auVar23[0xf] >> 4) + auVar23[0xf];
        auVar22 = psadbw(auVar38 & _DAT_01f1d7c0,(undefined1  [16])0x0);
        lVar6 = lVar6 + auVar22._0_8_;
        lVar8 = lVar8 + auVar22._8_8_;
        lVar4 = lVar4 + 2;
      } while (lVar4 != 4);
      lVar4 = 0;
      do {
        uVar5 = auStack_50[lVar4];
        uVar1 = (&local_88._M_string_length)[lVar4];
        (&local_88._M_dataplus)[lVar4]._M_p =
             (pointer)((ulong)(&local_88._M_dataplus)[lVar4]._M_p | (ulong)(&local_58)[lVar4]);
        (&local_88._M_string_length)[lVar4] = uVar1 | uVar5;
        lVar4 = lVar4 + 2;
      } while (lVar4 != 4);
      lVar4 = 0;
      lVar10 = 0;
      lVar11 = 0;
      do {
        auVar22 = *(undefined1 (*) [16])(&local_88._M_dataplus + lVar4);
        auVar42._0_2_ = auVar22._0_2_ >> 1;
        auVar42._2_2_ = auVar22._2_2_ >> 1;
        auVar42._4_2_ = auVar22._4_2_ >> 1;
        auVar42._6_2_ = auVar22._6_2_ >> 1;
        auVar42._8_2_ = auVar22._8_2_ >> 1;
        auVar42._10_2_ = auVar22._10_2_ >> 1;
        auVar42._12_2_ = auVar22._12_2_ >> 1;
        auVar42._14_2_ = auVar22._14_2_ >> 1;
        auVar42 = auVar42 & _DAT_01f1d7a0;
        uVar13 = CONCAT11(auVar22[1] - auVar42[1],auVar22[0] - auVar42[0]);
        uVar14 = CONCAT13(auVar22[3] - auVar42[3],CONCAT12(auVar22[2] - auVar42[2],uVar13));
        uVar15 = CONCAT15(auVar22[5] - auVar42[5],CONCAT14(auVar22[4] - auVar42[4],uVar14));
        uVar16 = CONCAT17(auVar22[7] - auVar42[7],CONCAT16(auVar22[6] - auVar42[6],uVar15));
        auVar33._0_10_ = CONCAT19(auVar22[9] - auVar42[9],CONCAT18(auVar22[8] - auVar42[8],uVar16));
        auVar33[10] = auVar22[10] - auVar42[10];
        auVar33[0xb] = auVar22[0xb] - auVar42[0xb];
        auVar35[0xc] = auVar22[0xc] - auVar42[0xc];
        auVar35._0_12_ = auVar33;
        auVar35[0xd] = auVar22[0xd] - auVar42[0xd];
        auVar39[0xe] = auVar22[0xe] - auVar42[0xe];
        auVar39._0_14_ = auVar35;
        auVar39[0xf] = auVar22[0xf] - auVar42[0xf];
        auVar22 = auVar39 & _DAT_01f1d7b0;
        auVar40._0_2_ = uVar13 >> 2;
        auVar40._2_2_ = (ushort)((uint)uVar14 >> 0x12);
        auVar40._4_2_ = (ushort)((uint6)uVar15 >> 0x22);
        auVar40._6_2_ = (ushort)((ulong)uVar16 >> 0x32);
        auVar40._8_2_ = (ushort)((unkuint10)auVar33._0_10_ >> 0x42);
        auVar40._10_2_ = auVar33._10_2_ >> 2;
        auVar40._12_2_ = auVar35._12_2_ >> 2;
        auVar40._14_2_ = auVar39._14_2_ >> 2;
        auVar40 = auVar40 & _DAT_01f1d7b0;
        cVar12 = auVar40[0] + auVar22[0];
        bVar24 = auVar40[1] + auVar22[1];
        uVar13 = CONCAT11(bVar24,cVar12);
        cVar25 = auVar40[2] + auVar22[2];
        bVar26 = auVar40[3] + auVar22[3];
        uVar14 = CONCAT13(bVar26,CONCAT12(cVar25,uVar13));
        cVar27 = auVar40[4] + auVar22[4];
        bVar28 = auVar40[5] + auVar22[5];
        uVar15 = CONCAT15(bVar28,CONCAT14(cVar27,uVar14));
        cVar29 = auVar40[6] + auVar22[6];
        bVar30 = auVar40[7] + auVar22[7];
        uVar16 = CONCAT17(bVar30,CONCAT16(cVar29,uVar15));
        cVar31 = auVar40[8] + auVar22[8];
        bVar32 = auVar40[9] + auVar22[9];
        auVar34._0_10_ = CONCAT19(bVar32,CONCAT18(cVar31,uVar16));
        auVar34[10] = auVar40[10] + auVar22[10];
        auVar34[0xb] = auVar40[0xb] + auVar22[0xb];
        auVar36[0xc] = auVar40[0xc] + auVar22[0xc];
        auVar36._0_12_ = auVar34;
        auVar36[0xd] = auVar40[0xd] + auVar22[0xd];
        auVar41[0xe] = auVar40[0xe] + auVar22[0xe];
        auVar41._0_14_ = auVar36;
        auVar41[0xf] = auVar40[0xf] + auVar22[0xf];
        auVar43[0] = (char)(uVar13 >> 4) + cVar12;
        auVar43[1] = (bVar24 >> 4) + bVar24;
        auVar43[2] = (char)(ushort)((uint)uVar14 >> 0x14) + cVar25;
        auVar43[3] = (bVar26 >> 4) + bVar26;
        auVar43[4] = (char)(ushort)((uint6)uVar15 >> 0x24) + cVar27;
        auVar43[5] = (bVar28 >> 4) + bVar28;
        auVar43[6] = (char)(ushort)((ulong)uVar16 >> 0x34) + cVar29;
        auVar43[7] = (bVar30 >> 4) + bVar30;
        auVar43[8] = (char)(ushort)((unkuint10)auVar34._0_10_ >> 0x44) + cVar31;
        auVar43[9] = (bVar32 >> 4) + bVar32;
        auVar43[10] = (char)(auVar34._10_2_ >> 4) + auVar34[10];
        auVar43[0xb] = (auVar34[0xb] >> 4) + auVar34[0xb];
        auVar43[0xc] = (char)(auVar36._12_2_ >> 4) + auVar36[0xc];
        auVar43[0xd] = (auVar36[0xd] >> 4) + auVar36[0xd];
        auVar43[0xe] = (char)(auVar41._14_2_ >> 4) + auVar41[0xe];
        auVar43[0xf] = (auVar41[0xf] >> 4) + auVar41[0xf];
        auVar22 = psadbw(auVar43 & _DAT_01f1d7c0,(undefined1  [16])0x0);
        lVar10 = lVar10 + auVar22._0_8_;
        lVar11 = lVar11 + auVar22._8_8_;
        lVar4 = lVar4 + 2;
      } while (lVar4 != 4);
      auVar9._0_8_ = lVar8 + lVar6;
      auVar7._0_8_ = lVar11 + lVar10;
      auVar9._8_4_ = (int)((ulong)auVar9._0_8_ >> 0x20);
      auVar9._12_4_ = 0x45300000;
      auVar7._8_4_ = (int)((ulong)auVar7._0_8_ >> 0x20);
      auVar7._12_4_ = 0x45300000;
      return ((auVar9._8_8_ - 1.9342813113834067e+25) +
             ((double)CONCAT44(0x43300000,(int)auVar9._0_8_) - 4503599627370496.0)) /
             ((auVar7._8_8_ - 1.9342813113834067e+25) +
             ((double)CONCAT44(0x43300000,(int)auVar7._0_8_) - 4503599627370496.0));
    }
  }
  local_68 = uVar5;
  this = (InvalidInputException *)__cxa_allocate_exception(0x10);
  local_88._M_dataplus._M_p = (pointer)&local_88.field_2;
  ::std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_88,"Jaccard Function: An argument too short!","");
  InvalidInputException::InvalidInputException(this,&local_88);
  __cxa_throw(this,&InvalidInputException::typeinfo,::std::runtime_error::~runtime_error);
}

Assistant:

static inline RESULT_TYPE Operation(FUNC fun, LEFT_TYPE left, RIGHT_TYPE right, ValidityMask &mask, idx_t idx) {
		return fun(left, right);
	}